

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode build_message(SASL *sasl,bufref *msg)

{
  uchar *puVar1;
  size_t sVar2;
  size_t local_30;
  size_t base64len;
  char *base64;
  bufref *pbStack_18;
  CURLcode result;
  bufref *msg_local;
  SASL *sasl_local;
  
  base64._4_4_ = CURLE_OK;
  if ((sasl->params->flags & 1) != 0) {
    pbStack_18 = msg;
    msg_local = (bufref *)sasl;
    puVar1 = Curl_bufref_ptr(msg);
    if (puVar1 == (uchar *)0x0) {
      Curl_bufref_set(pbStack_18,"",0,(_func_void_void_ptr *)0x0);
    }
    else {
      sVar2 = Curl_bufref_len(pbStack_18);
      if (sVar2 == 0) {
        Curl_bufref_set(pbStack_18,"=",1,(_func_void_void_ptr *)0x0);
      }
      else {
        puVar1 = Curl_bufref_ptr(pbStack_18);
        sVar2 = Curl_bufref_len(pbStack_18);
        base64._4_4_ = Curl_base64_encode((char *)puVar1,sVar2,(char **)&base64len,&local_30);
        if (base64._4_4_ == CURLE_OK) {
          Curl_bufref_set(pbStack_18,(void *)base64len,local_30,curl_free);
        }
      }
    }
  }
  return base64._4_4_;
}

Assistant:

static CURLcode build_message(struct SASL *sasl, struct bufref *msg)
{
  CURLcode result = CURLE_OK;

  if(sasl->params->flags & SASL_FLAG_BASE64) {
    if(!Curl_bufref_ptr(msg))                   /* Empty message. */
      Curl_bufref_set(msg, "", 0, NULL);
    else if(!Curl_bufref_len(msg))              /* Explicit empty response. */
      Curl_bufref_set(msg, "=", 1, NULL);
    else {
      char *base64;
      size_t base64len;

      result = Curl_base64_encode((const char *) Curl_bufref_ptr(msg),
                                  Curl_bufref_len(msg), &base64, &base64len);
      if(!result)
        Curl_bufref_set(msg, base64, base64len, curl_free);
    }
  }

  return result;
}